

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_output_proof_init
              (wally_tx_output *output,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len)

{
  _Bool _Var1;
  uchar *local_48;
  uchar *new_rangeproof;
  uchar *new_surjectionproof;
  size_t rangeproof_len_local;
  uchar *rangeproof_local;
  size_t surjectionproof_len_local;
  uchar *surjectionproof_local;
  wally_tx_output *output_local;
  
  new_rangeproof = (uchar *)0x0;
  local_48 = (uchar *)0x0;
  if (((surjectionproof != (uchar *)0x0) == (surjectionproof_len != 0)) &&
     ((rangeproof != (uchar *)0x0) == (rangeproof_len != 0))) {
    new_surjectionproof = (uchar *)rangeproof_len;
    rangeproof_len_local = (size_t)rangeproof;
    rangeproof_local = (uchar *)surjectionproof_len;
    surjectionproof_len_local = (size_t)surjectionproof;
    surjectionproof_local = (uchar *)output;
    _Var1 = clone_bytes(&new_rangeproof,surjectionproof,surjectionproof_len);
    if ((_Var1) &&
       (_Var1 = clone_bytes(&local_48,(uchar *)rangeproof_len_local,(size_t)new_surjectionproof),
       _Var1)) {
      *(uchar **)(surjectionproof_local + 0x50) = new_rangeproof;
      *(uchar **)(surjectionproof_local + 0x58) = rangeproof_local;
      *(uchar **)(surjectionproof_local + 0x60) = local_48;
      *(uchar **)(surjectionproof_local + 0x68) = new_surjectionproof;
      output_local._4_4_ = 0;
    }
    else {
      clear_and_free(new_rangeproof,(size_t)rangeproof_local);
      clear_and_free(local_48,(size_t)new_surjectionproof);
      output_local._4_4_ = -3;
    }
  }
  else {
    output_local._4_4_ = -2;
  }
  return output_local._4_4_;
}

Assistant:

static int tx_elements_output_proof_init(
    struct wally_tx_output *output,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_surjectionproof = NULL, *new_rangeproof = NULL;
#endif
    (void) output;

    if (BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_surjectionproof, surjectionproof, surjectionproof_len) ||
        !clone_bytes(&new_rangeproof, rangeproof, rangeproof_len)) {
        clear_and_free(new_surjectionproof,  surjectionproof_len);
        clear_and_free(new_rangeproof, rangeproof_len);
        return WALLY_ENOMEM;
    }

    output->surjectionproof = new_surjectionproof;
    output->surjectionproof_len = surjectionproof_len;
    output->rangeproof = new_rangeproof;
    output->rangeproof_len = rangeproof_len;
#endif
    return WALLY_OK;
}